

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegularExpression.cxx
# Opt level: O0

bool __thiscall cmsys::RegularExpression::find(RegularExpression *this,char *string)

{
  char cVar1;
  int iVar2;
  char *local_28;
  char *s;
  char *string_local;
  RegularExpression *this_local;
  
  this->searchstring = string;
  if (this->program == (char *)0x0) {
    this_local._7_1_ = false;
  }
  else if (*this->program == -100) {
    local_28 = string;
    if (this->regmust != (char *)0x0) {
      while ((local_28 = strchr(local_28,(int)*this->regmust), local_28 != (char *)0x0 &&
             (iVar2 = strncmp(local_28,this->regmust,this->regmlen), iVar2 != 0))) {
        local_28 = local_28 + 1;
      }
      if (local_28 == (char *)0x0) {
        return false;
      }
    }
    regbol = string;
    if (this->reganch == '\0') {
      local_28 = string;
      if (this->regstart == '\0') {
        do {
          iVar2 = regtry(local_28,this->startp,this->endp,this->program);
          if (iVar2 != 0) {
            return true;
          }
          cVar1 = *local_28;
          local_28 = local_28 + 1;
        } while (cVar1 != '\0');
      }
      else {
        while (local_28 = strchr(local_28,(int)this->regstart), local_28 != (char *)0x0) {
          iVar2 = regtry(local_28,this->startp,this->endp,this->program);
          if (iVar2 != 0) {
            return true;
          }
          local_28 = local_28 + 1;
        }
      }
      this_local._7_1_ = false;
    }
    else {
      iVar2 = regtry(string,this->startp,this->endp,this->program);
      this_local._7_1_ = iVar2 != 0;
    }
  }
  else {
    printf("RegularExpression::find(): Compiled regular expression corrupted.\n");
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool RegularExpression::find (const char* string) {
    const char* s;

    this->searchstring = string;

    if (!this->program)
      {
      return false;
      }

    // Check validity of program.
    if (UCHARAT(this->program) != MAGIC) {
        //RAISE Error, SYM(RegularExpression), SYM(Internal_Error),
        printf ("RegularExpression::find(): Compiled regular expression corrupted.\n");
        return 0;
    }

    // If there is a "must appear" string, look for it.
    if (this->regmust != 0) {
        s = string;
        while ((s = strchr(s, this->regmust[0])) != 0) {
            if (strncmp(s, this->regmust, this->regmlen) == 0)
                break;          // Found it.
            s++;
        }
        if (s == 0)             // Not present.
            return (0);
    }

    // Mark beginning of line for ^ .
    regbol = string;

    // Simplest case:  anchored match need be tried only once.
    if (this->reganch)
        return (regtry(string, this->startp, this->endp, this->program) != 0);

    // Messy cases:  unanchored match.
    s = string;
    if (this->regstart != '\0')
        // We know what char it must start with.
        while ((s = strchr(s, this->regstart)) != 0) {
            if (regtry(s, this->startp, this->endp, this->program))
                return (1);
            s++;

        }
    else
        // We don't -- general case.
        do {
            if (regtry(s, this->startp, this->endp, this->program))
                return (1);
        } while (*s++ != '\0');

    // Failure.
    return (0);
}